

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mipsdsp_add_cmp_pick
               (DisasContext_conflict6 *ctx,uint32_t op1,uint32_t op2,int ret,int v1,int v2,
               int check_ret)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 arg1;
  TCGv_i64 pTVar1;
  TCGv_i64 t;
  int nargs;
  TCGTemp *ret_00;
  uintptr_t o_1;
  code *func;
  uintptr_t o;
  uintptr_t o_38;
  TCGTemp *local_58;
  TCGv_i64 local_50;
  TCGv_ptr local_48;
  TCGv_i64 local_40;
  TCGv_i64 local_38;
  
  if (check_ret == 1 && ret == 0) {
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  local_40 = tcg_temp_new_i64(tcg_ctx);
  pTVar1 = tcg_temp_new_i64(tcg_ctx);
  t = tcg_temp_new_i64(tcg_ctx);
  local_38 = pTVar1;
  gen_load_gpr(tcg_ctx,pTVar1,v1);
  gen_load_gpr(tcg_ctx,t,v2);
  arg1 = local_38;
  pTVar1 = local_40;
  if (op1 != 0x7c000015) {
    if (op1 != 0x7c000011) goto switchD_0088e76a_caseD_7;
    switch((op2 + 0x83ffffef) * 0x4000000 | op2 + 0x83ffffef >> 6) {
    case 0:
      check_dsp(ctx);
      gen_helper_cmpu_eq_qb(tcg_ctx,arg1,t,tcg_ctx->cpu_env);
      break;
    case 1:
      check_dsp(ctx);
      gen_helper_cmpu_lt_qb(tcg_ctx,arg1,t,tcg_ctx->cpu_env);
      break;
    case 2:
      check_dsp(ctx);
      gen_helper_cmpu_le_qb(tcg_ctx,arg1,t,tcg_ctx->cpu_env);
      break;
    case 3:
      check_dsp(ctx);
      gen_helper_pick_qb(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],arg1,t,tcg_ctx->cpu_env);
      break;
    case 4:
      check_dsp(ctx);
      gen_helper_cmpgu_eq_qb(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],arg1,t);
      break;
    case 5:
      check_dsp(ctx);
      gen_helper_cmpgu_lt_qb(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],arg1,t);
      break;
    case 6:
      check_dsp(ctx);
      gen_helper_cmpgu_le_qb(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],arg1,t);
      break;
    case 8:
      check_dsp(ctx);
      gen_helper_cmp_eq_ph(tcg_ctx,arg1,t,tcg_ctx->cpu_env);
      break;
    case 9:
      check_dsp(ctx);
      gen_helper_cmp_lt_ph(tcg_ctx,arg1,t,tcg_ctx->cpu_env);
      break;
    case 10:
      check_dsp(ctx);
      gen_helper_cmp_le_ph(tcg_ctx,arg1,t,tcg_ctx->cpu_env);
      break;
    case 0xb:
      check_dsp(ctx);
      gen_helper_pick_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],arg1,t,tcg_ctx->cpu_env);
      break;
    case 0xe:
      check_dsp(ctx);
      gen_helper_packrl_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],arg1,t);
      break;
    case 0x18:
      check_dsp_r2(ctx);
      gen_helper_cmpgu_eq_qb(tcg_ctx,pTVar1,arg1,t);
      goto LAB_0088e969;
    case 0x19:
      check_dsp_r2(ctx);
      gen_helper_cmpgu_lt_qb(tcg_ctx,pTVar1,arg1,t);
      goto LAB_0088e969;
    case 0x1a:
      check_dsp_r2(ctx);
      gen_helper_cmpgu_le_qb(tcg_ctx,pTVar1,arg1,t);
LAB_0088e969:
      tcg_gen_mov_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],pTVar1);
      tcg_gen_andi_i64_mips64el(tcg_ctx,tcg_ctx->cpu_dspctrl,tcg_ctx->cpu_dspctrl,0xf0ffffff);
      tcg_gen_shli_i64_mips64el(tcg_ctx,pTVar1,pTVar1,0x18);
      tcg_gen_or_i64_mips64el(tcg_ctx,tcg_ctx->cpu_dspctrl,tcg_ctx->cpu_dspctrl,pTVar1);
    }
    goto switchD_0088e76a_caseD_7;
  }
  switch((op2 + 0x83ffffeb) * 0x4000000 | op2 + 0x83ffffeb >> 6) {
  case 0:
    check_dsp(ctx);
    local_48 = tcg_ctx->cpu_env + (long)tcg_ctx;
    func = helper_cmpu_eq_ob_mips64el;
    break;
  case 1:
    check_dsp(ctx);
    local_48 = tcg_ctx->cpu_env + (long)tcg_ctx;
    func = helper_cmpu_lt_ob_mips64el;
    break;
  case 2:
    check_dsp(ctx);
    local_48 = tcg_ctx->cpu_env + (long)tcg_ctx;
    func = helper_cmpu_le_ob_mips64el;
    break;
  case 3:
    check_dsp(ctx);
    local_48 = tcg_ctx->cpu_env + (long)tcg_ctx;
    ret_00 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    func = helper_pick_ob_mips64el;
    goto LAB_0088eeb0;
  case 4:
    check_dsp(ctx);
    ret_00 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    func = helper_cmpgu_eq_ob_mips64el;
    goto LAB_0088ecf7;
  case 5:
    check_dsp(ctx);
    ret_00 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    func = helper_cmpgu_lt_ob_mips64el;
    goto LAB_0088ecf7;
  case 6:
    check_dsp(ctx);
    ret_00 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    func = helper_cmpgu_le_ob_mips64el;
    goto LAB_0088ecf7;
  default:
    goto switchD_0088e76a_caseD_7;
  case 8:
    check_dsp(ctx);
    local_48 = tcg_ctx->cpu_env + (long)tcg_ctx;
    func = helper_cmp_eq_qh_mips64el;
    break;
  case 9:
    check_dsp(ctx);
    local_48 = tcg_ctx->cpu_env + (long)tcg_ctx;
    func = helper_cmp_lt_qh_mips64el;
    break;
  case 10:
    check_dsp(ctx);
    local_48 = tcg_ctx->cpu_env + (long)tcg_ctx;
    func = helper_cmp_le_qh_mips64el;
    break;
  case 0xb:
    check_dsp(ctx);
    local_48 = tcg_ctx->cpu_env + (long)tcg_ctx;
    ret_00 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    func = helper_pick_qh_mips64el;
    goto LAB_0088eeb0;
  case 0xe:
    check_dsp(ctx);
    ret_00 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    func = helper_packrl_pw_mips64el;
LAB_0088ecf7:
    nargs = 2;
    goto LAB_0088eeb6;
  case 0x10:
    check_dsp(ctx);
    local_48 = tcg_ctx->cpu_env + (long)tcg_ctx;
    func = helper_cmp_eq_pw_mips64el;
    break;
  case 0x11:
    check_dsp(ctx);
    local_48 = tcg_ctx->cpu_env + (long)tcg_ctx;
    func = helper_cmp_lt_pw_mips64el;
    break;
  case 0x12:
    check_dsp(ctx);
    local_48 = tcg_ctx->cpu_env + (long)tcg_ctx;
    func = helper_cmp_le_pw_mips64el;
    break;
  case 0x13:
    check_dsp(ctx);
    local_48 = tcg_ctx->cpu_env + (long)tcg_ctx;
    ret_00 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    func = helper_pick_pw_mips64el;
    goto LAB_0088eeb0;
  case 0x18:
    check_dsp_r2(ctx);
    local_48 = tcg_ctx->cpu_env + (long)tcg_ctx;
    ret_00 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    func = helper_cmpgdu_eq_ob_mips64el;
    goto LAB_0088eeb0;
  case 0x19:
    check_dsp_r2(ctx);
    local_48 = tcg_ctx->cpu_env + (long)tcg_ctx;
    ret_00 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    func = helper_cmpgdu_lt_ob_mips64el;
    goto LAB_0088eeb0;
  case 0x1a:
    check_dsp_r2(ctx);
    local_48 = tcg_ctx->cpu_env + (long)tcg_ctx;
    ret_00 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
    func = helper_cmpgdu_le_ob_mips64el;
LAB_0088eeb0:
    nargs = 3;
    goto LAB_0088eeb6;
  }
  nargs = 3;
  ret_00 = (TCGTemp *)0x0;
LAB_0088eeb6:
  local_50 = t + (long)&tcg_ctx->pool_cur;
  local_58 = (TCGTemp *)(arg1 + (long)&tcg_ctx->pool_cur);
  tcg_gen_callN_mips64el(tcg_ctx,func,ret_00,nargs,&local_58);
switchD_0088e76a_caseD_7:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(arg1 + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_mipsdsp_add_cmp_pick(DisasContext *ctx,
                                     uint32_t op1, uint32_t op2,
                                     int ret, int v1, int v2, int check_ret)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t1;
    TCGv v1_t;
    TCGv v2_t;

    if ((ret == 0) && (check_ret == 1)) {
        /* Treat as NOP. */
        return;
    }

    t1 = tcg_temp_new(tcg_ctx);
    v1_t = tcg_temp_new(tcg_ctx);
    v2_t = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, v1_t, v1);
    gen_load_gpr(tcg_ctx, v2_t, v2);

    switch (op1) {
    case OPC_CMPU_EQ_QB_DSP:
        switch (op2) {
        case OPC_CMPU_EQ_QB:
            check_dsp(ctx);
            gen_helper_cmpu_eq_qb(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPU_LT_QB:
            check_dsp(ctx);
            gen_helper_cmpu_lt_qb(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPU_LE_QB:
            check_dsp(ctx);
            gen_helper_cmpu_le_qb(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPGU_EQ_QB:
            check_dsp(ctx);
            gen_helper_cmpgu_eq_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_CMPGU_LT_QB:
            check_dsp(ctx);
            gen_helper_cmpgu_lt_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_CMPGU_LE_QB:
            check_dsp(ctx);
            gen_helper_cmpgu_le_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_CMPGDU_EQ_QB:
            check_dsp_r2(ctx);
            gen_helper_cmpgu_eq_qb(tcg_ctx, t1, v1_t, v2_t);
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], t1);
            tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_dspctrl, tcg_ctx->cpu_dspctrl, 0xF0FFFFFF);
            tcg_gen_shli_tl(tcg_ctx, t1, t1, 24);
            tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_dspctrl, tcg_ctx->cpu_dspctrl, t1);
            break;
        case OPC_CMPGDU_LT_QB:
            check_dsp_r2(ctx);
            gen_helper_cmpgu_lt_qb(tcg_ctx, t1, v1_t, v2_t);
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], t1);
            tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_dspctrl, tcg_ctx->cpu_dspctrl, 0xF0FFFFFF);
            tcg_gen_shli_tl(tcg_ctx, t1, t1, 24);
            tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_dspctrl, tcg_ctx->cpu_dspctrl, t1);
            break;
        case OPC_CMPGDU_LE_QB:
            check_dsp_r2(ctx);
            gen_helper_cmpgu_le_qb(tcg_ctx, t1, v1_t, v2_t);
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], t1);
            tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_dspctrl, tcg_ctx->cpu_dspctrl, 0xF0FFFFFF);
            tcg_gen_shli_tl(tcg_ctx, t1, t1, 24);
            tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_dspctrl, tcg_ctx->cpu_dspctrl, t1);
            break;
        case OPC_CMP_EQ_PH:
            check_dsp(ctx);
            gen_helper_cmp_eq_ph(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMP_LT_PH:
            check_dsp(ctx);
            gen_helper_cmp_lt_ph(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMP_LE_PH:
            check_dsp(ctx);
            gen_helper_cmp_le_ph(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PICK_QB:
            check_dsp(ctx);
            gen_helper_pick_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PICK_PH:
            check_dsp(ctx);
            gen_helper_pick_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PACKRL_PH:
            check_dsp(ctx);
            gen_helper_packrl_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        }
        break;
#ifdef TARGET_MIPS64
    case OPC_CMPU_EQ_OB_DSP:
        switch (op2) {
        case OPC_CMP_EQ_PW:
            check_dsp(ctx);
            gen_helper_cmp_eq_pw(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMP_LT_PW:
            check_dsp(ctx);
            gen_helper_cmp_lt_pw(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMP_LE_PW:
            check_dsp(ctx);
            gen_helper_cmp_le_pw(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMP_EQ_QH:
            check_dsp(ctx);
            gen_helper_cmp_eq_qh(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMP_LT_QH:
            check_dsp(ctx);
            gen_helper_cmp_lt_qh(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMP_LE_QH:
            check_dsp(ctx);
            gen_helper_cmp_le_qh(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPGDU_EQ_OB:
            check_dsp_r2(ctx);
            gen_helper_cmpgdu_eq_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPGDU_LT_OB:
            check_dsp_r2(ctx);
            gen_helper_cmpgdu_lt_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPGDU_LE_OB:
            check_dsp_r2(ctx);
            gen_helper_cmpgdu_le_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPGU_EQ_OB:
            check_dsp(ctx);
            gen_helper_cmpgu_eq_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_CMPGU_LT_OB:
            check_dsp(ctx);
            gen_helper_cmpgu_lt_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_CMPGU_LE_OB:
            check_dsp(ctx);
            gen_helper_cmpgu_le_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_CMPU_EQ_OB:
            check_dsp(ctx);
            gen_helper_cmpu_eq_ob(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPU_LT_OB:
            check_dsp(ctx);
            gen_helper_cmpu_lt_ob(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPU_LE_OB:
            check_dsp(ctx);
            gen_helper_cmpu_le_ob(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PACKRL_PW:
            check_dsp(ctx);
            gen_helper_packrl_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PICK_OB:
            check_dsp(ctx);
            gen_helper_pick_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PICK_PW:
            check_dsp(ctx);
            gen_helper_pick_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PICK_QH:
            check_dsp(ctx);
            gen_helper_pick_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
#endif
    }

    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, v1_t);
    tcg_temp_free(tcg_ctx, v2_t);
}